

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.h
# Opt level: O3

void __thiscall RtMidiError::RtMidiError(RtMidiError *this,RtMidiError *param_1)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__RtMidiError_00115640;
  (this->message_)._M_dataplus._M_p = (pointer)&(this->message_).field_2;
  pcVar1 = (param_1->message_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->message_,pcVar1,pcVar1 + (param_1->message_)._M_string_length);
  this->type_ = param_1->type_;
  return;
}

Assistant:

class RTMIDI_DLL_PUBLIC RtMidiError : public std::exception
{
 public:
  //! Defined RtMidiError types.
  enum Type {
    WARNING,           /*!< A non-critical error. */
    DEBUG_WARNING,     /*!< A non-critical error which might be useful for debugging. */
    UNSPECIFIED,       /*!< The default, unspecified error type. */
    NO_DEVICES_FOUND,  /*!< No devices found on system. */
    INVALID_DEVICE,    /*!< An invalid device ID was specified. */
    MEMORY_ERROR,      /*!< An error occured during memory allocation. */
    INVALID_PARAMETER, /*!< An invalid parameter was specified to a function. */
    INVALID_USE,       /*!< The function was called incorrectly. */
    DRIVER_ERROR,      /*!< A system driver error occured. */
    SYSTEM_ERROR,      /*!< A system error occured. */
    THREAD_ERROR       /*!< A thread error occured. */
  };

  //! The constructor.
  RtMidiError( const std::string& message, Type type = RtMidiError::UNSPECIFIED ) throw()
    : message_(message), type_(type) {}

  //! The destructor.
  virtual ~RtMidiError( void ) throw() {}

  //! Prints thrown error message to stderr.
  virtual void printMessage( void ) const throw() { std::cerr << '\n' << message_ << "\n\n"; }

  //! Returns the thrown error message type.
  virtual const Type& getType( void ) const throw() { return type_; }

  //! Returns the thrown error message string.
  virtual const std::string& getMessage( void ) const throw() { return message_; }

  //! Returns the thrown error message as a c-style string.
  virtual const char* what( void ) const throw() { return message_.c_str(); }

 protected:
  std::string message_;
  Type type_;
}